

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

int Gia_ManFindEqualFlop(Vec_Ptr_t *vFlops,int iFlop,int nFlopWords)

{
  int iVar1;
  void *__s2;
  void *__s1;
  int i;
  
  __s2 = Vec_PtrEntry(vFlops,iFlop);
  i = 0;
  if (iFlop < 1) {
    iFlop = 0;
  }
  while( true ) {
    if (iFlop == i) {
      return -1;
    }
    __s1 = Vec_PtrEntry(vFlops,i);
    iVar1 = bcmp(__s1,__s2,(long)nFlopWords << 2);
    if (iVar1 == 0) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int Gia_ManFindEqualFlop( Vec_Ptr_t * vFlops, int iFlop, int nFlopWords )
{
    unsigned * pFlop, * pTemp;
    int i;
    pFlop = (unsigned *)Vec_PtrEntry( vFlops, iFlop );
    Vec_PtrForEachEntryStop( unsigned *, vFlops, pTemp, i, iFlop )
        if ( !memcmp( pTemp, pFlop, sizeof(unsigned) * nFlopWords ) )
            return i;
    return -1;
}